

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall AGSSock::Pool::Pool(Pool *this)

{
  anon_class_8_1_8991fb9c local_48;
  Callback local_40;
  Pool *local_10;
  Pool *this_local;
  
  local_10 = this;
  std::
  unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
  ::unordered_set(&this->sockets_);
  AGSSockAPI::Mutex::Mutex(&this->guard_);
  AGSSockAPI::Beacon::Beacon(&this->beacon_);
  local_48.this = this;
  std::function<void()>::function<AGSSock::Pool::Pool()::_lambda()_1_,void>
            ((function<void()> *)&local_40,&local_48);
  AGSSockAPI::Thread::Thread(&this->thread_,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

Pool() : thread_([this]() { run(); }) {}